

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::ICULCPTranscoder::transcode
          (ICULCPTranscoder *this,char *toTranscode,XMLCh *toFill,XMLSize_t maxChars,
          MemoryManager *manager)

{
  UBool UVar1;
  size_t sVar2;
  XMLMutexLock local_58;
  XMLMutexLock lockConverter;
  UErrorCode err;
  UChar *targetBuf;
  XMLSize_t srcLen;
  MemoryManager *manager_local;
  XMLSize_t maxChars_local;
  XMLCh *toFill_local;
  char *toTranscode_local;
  ICULCPTranscoder *this_local;
  
  if ((toTranscode == (char *)0x0) || (maxChars == 0)) {
    *toFill = L'\0';
    this_local._7_1_ = true;
  }
  else if (*toTranscode == '\0') {
    *toFill = L'\0';
    this_local._7_1_ = true;
  }
  else {
    sVar2 = strlen(toTranscode);
    lockConverter.fToLock._4_4_ = U_ZERO_ERROR;
    XMLMutexLock::XMLMutexLock(&local_58,&this->fMutex);
    manager_local._0_4_ = (int)maxChars;
    ucnv_toUChars_70(this->fConverter,toFill,(int)manager_local + 1,toTranscode,sVar2 & 0xffffffff,
                     (undefined1 *)((long)&lockConverter.fToLock + 4));
    XMLMutexLock::~XMLMutexLock(&local_58);
    UVar1 = U_FAILURE(lockConverter.fToLock._4_4_);
    if (UVar1 == '\0') {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ICULCPTranscoder::transcode(const  char* const     toTranscode
                                ,       XMLCh* const    toFill
                                , const XMLSize_t       maxChars
                                , MemoryManager* const  manager)
{
    // Check for a couple of psycho corner cases
    if (!toTranscode || !maxChars)
    {
        toFill[0] = 0;
        return true;
    }

    if (!*toTranscode)
    {
        toFill[0] = 0;
        return true;
    }

    // We'll need this in a couple of places below
    const XMLSize_t srcLen = strlen(toTranscode);

    //
    //  Set up the target buffer. If XMLCh and UChar are not the same size
    //  then we have to use a temp buffer and convert over.
    //
    UChar* targetBuf;
    if (sizeof(XMLCh) == sizeof(UChar))
        targetBuf = (UChar*)toFill;
    else
        targetBuf = (UChar*) manager->allocate
        (
            (maxChars + 1) * sizeof(UChar)
        );//new UChar[maxChars + 1];

    //
    //  Use a faux block to enforce a lock on the converter, which will
    //  unlock immediately after its completed.
    //
    UErrorCode err = U_ZERO_ERROR;
    {
        XMLMutexLock lockConverter(&fMutex);
        ucnv_toUChars
        (
            fConverter
            , targetBuf
            , (int32_t)maxChars + 1
            , toTranscode
            , (int32_t)srcLen
            , &err
        );
    }

    if (U_FAILURE(err))
    {
        if (targetBuf != (UChar*)toFill)
            manager->deallocate(targetBuf);//delete [] targetBuf;
        return false;
    }

    // If the sizes are not the same, then copy the data over
    if (sizeof(XMLCh) != sizeof(UChar))
    {
        UChar* srcPtr = targetBuf;
        XMLCh* outPtr = toFill;
        while (*srcPtr)
            *outPtr++ = XMLCh(*srcPtr++);
        *outPtr = 0;

        // And delete the temp buffer
        manager->deallocate(targetBuf);//delete [] targetBuf;
    }

    return true;
}